

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O1

shared_ptr<gui::DialogBox> __thiscall
gui::DialogBox::create(DialogBox *this,shared_ptr<gui::DialogBoxStyle> *style,String *name)

{
  DialogBox *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<gui::DialogBox> sVar2;
  shared_ptr<gui::DialogBoxStyle> local_38;
  
  this_00 = (DialogBox *)operator_new(0x278);
  local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (style->super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (style->super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  DialogBox(this_00,&local_38,name);
  (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase =
       (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<gui::DialogBox*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_Group).super_Container.super_ContainerBase.children_,this_00);
  std::__shared_ptr<gui::DialogBox,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<gui::DialogBox,gui::DialogBox>
            ((__shared_ptr<gui::DialogBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  _Var1._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::DialogBox>)
         sVar2.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DialogBox> DialogBox::create(std::shared_ptr<DialogBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<DialogBox>(new DialogBox(style, name));
}